

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Trim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *p;
  char *pcVar3;
  uint local_4c;
  int fPoFedByPi;
  int fDualOut;
  int fTrimCos;
  int fTrimCis;
  int OutValue;
  int c;
  Gia_Man_t *pTemp2;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fTrimCos = -1;
  fDualOut = 1;
  fPoFedByPi = 1;
  local_4c = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Viocdh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Trim(): There is no AIG.\n");
        return 1;
      }
      p = Gia_ManDupTrimmed(pAbc->pGia,fDualOut,fPoFedByPi,local_4c,fTrimCos);
      pTemp2 = p;
      if (bVar1) {
        pTemp2 = Gia_ManDupTrimmed2(p);
        Gia_ManStop(p);
      }
      Abc_FrameUpdateGia(pAbc,pTemp2);
      return 0;
    }
    switch(iVar2) {
    case 0x56:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-V\" should be followed by an integer.\n");
        goto LAB_0025c219;
      }
      fTrimCos = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fTrimCos < 0) {
LAB_0025c219:
        Abc_Print(-2,"usage: &trim [-V num] [-iocdh]\n");
        Abc_Print(-2,"\t         removes PIs without fanout and PO driven by constants\n");
        Abc_Print(-2,"\t-V num : the value (0 or 1) of POs to remove [default = both]\n");
        pcVar3 = "no";
        if (fDualOut != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-i     : toggle removing PIs [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (fPoFedByPi != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-o     : toggle removing POs [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (bVar1) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-c     : toggle additionally removing POs fed by PIs [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (local_4c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle using dual-output miter [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_0025c219;
    case 99:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 100:
      local_4c = local_4c ^ 1;
      break;
    case 0x68:
      goto LAB_0025c219;
    case 0x69:
      fDualOut = fDualOut ^ 1;
      break;
    case 0x6f:
      fPoFedByPi = fPoFedByPi ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Trim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp, * pTemp2;
    int c;
    int OutValue = -1;
    int fTrimCis = 1;
    int fTrimCos = 1;
    int fDualOut = 0;
    int fPoFedByPi = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Viocdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            OutValue = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( OutValue < 0 )
                goto usage;
            break;
        case 'i':
            fTrimCis ^= 1;
            break;
        case 'o':
            fTrimCos ^= 1;
            break;
        case 'c':
            fPoFedByPi ^= 1;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Trim(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManDupTrimmed( pAbc->pGia, fTrimCis, fTrimCos, fDualOut, OutValue );
    if ( fPoFedByPi )
    {
        extern Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p );
        pTemp = Gia_ManDupTrimmed2( pTemp2 = pTemp );
        Gia_ManStop( pTemp2 );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &trim [-V num] [-iocdh]\n" );
    Abc_Print( -2, "\t         removes PIs without fanout and PO driven by constants\n" );
    Abc_Print( -2, "\t-V num : the value (0 or 1) of POs to remove [default = both]\n" );
    Abc_Print( -2, "\t-i     : toggle removing PIs [default = %s]\n", fTrimCis? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle removing POs [default = %s]\n", fTrimCos? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle additionally removing POs fed by PIs [default = %s]\n", fPoFedByPi? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}